

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O1

adjusted_mantissa
fast_float::digit_comp<double,char>(parsed_number_string_t<char> *num,adjusted_mantissa am)

{
  limb *plVar1;
  long lVar2;
  bool bVar3;
  uint64_t uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int32_t in_R8D;
  adjusted_mantissa aVar10;
  adjusted_mantissa am_00;
  size_t digits;
  bigint bigmant;
  bool local_231;
  size_t local_230;
  bigint local_228;
  
  uVar5 = num->mantissa;
  iVar6 = (int)num->exponent;
  uVar8 = uVar5;
  if (9999 < uVar5) {
    do {
      uVar5 = uVar8 / 10000;
      iVar6 = iVar6 + 4;
      bVar3 = 99999999 < uVar8;
      uVar8 = uVar5;
    } while (bVar3);
  }
  uVar8 = uVar5;
  if (99 < uVar5) {
    do {
      uVar8 = uVar5 / 100;
      iVar6 = iVar6 + 2;
      bVar3 = 9999 < uVar5;
      uVar5 = uVar8;
    } while (bVar3);
  }
  if (9 < uVar8) {
    do {
      iVar6 = iVar6 + 1;
      bVar3 = 99 < uVar8;
      uVar8 = uVar8 / 10;
    } while (bVar3);
  }
  local_230 = 0;
  memset(&local_228,0,0x1f8);
  parse_mantissa<char>(&local_228,num,0x301,&local_230);
  uVar7 = (iVar6 - (int)local_230) + 1;
  if ((int)uVar7 < 0) {
    am_00.mantissa = (ulong)(am.power2 + 0x8000);
    am_00.power2 = uVar7;
    am_00._12_4_ = 0;
    aVar10 = negative_digit_comp<double>
                       ((fast_float *)&local_228,(bigint *)am.mantissa,am_00,in_R8D);
  }
  else {
    bVar3 = bigint::pow5(&local_228,uVar7);
    if (bVar3) {
      bigint::shl(&local_228,(ulong)uVar7);
    }
    uVar4 = bigint::hi64(&local_228,&local_231);
    if ((ulong)local_228.vec.length == 0) {
      uVar7 = 0;
    }
    else {
      plVar1 = local_228.vec.data + ((ulong)local_228.vec.length - 1);
      lVar2 = 0x3f;
      if (*plVar1 != 0) {
        for (; *plVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar7 = (uint)lVar2 ^ 0x3f;
    }
    uVar9 = (uint)uVar4 & 0x7ff;
    uVar5 = 1;
    if ((uVar9 < 0x401) && ((uVar9 != 0x400 || (local_231 == false)))) {
      uVar5 = (ulong)(((uint)uVar4 & 0xfff) == 0xc00);
    }
    uVar5 = (uVar4 >> 0xb) + uVar5;
    bVar3 = uVar5 >> 0x35 == 0;
    iVar6 = ((uint)local_228.vec.length * 0x40 - uVar7) + (bVar3 ^ 0x3ff);
    uVar5 = uVar5 & 0x2fffffffffffff;
    if (!bVar3) {
      uVar5 = 0;
    }
    if (0x7fe < iVar6) {
      uVar5 = 0;
    }
    aVar10.power2 = iVar6;
    aVar10.mantissa = uVar5;
    aVar10._12_4_ = 0;
    if (0x7fe < iVar6) {
      aVar10._8_8_ = 0x7ff;
    }
  }
  return aVar10;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa digit_comp(parsed_number_string_t<UC>& num, adjusted_mantissa am) noexcept {
  // remove the invalid exponent bias
  am.power2 -= invalid_am_bias;

  int32_t sci_exp = scientific_exponent(num);
  size_t max_digits = binary_format<T>::max_digits();
  size_t digits = 0;
  bigint bigmant;
  parse_mantissa(bigmant, num, max_digits, digits);
  // can't underflow, since digits is at most max_digits.
  int32_t exponent = sci_exp + 1 - int32_t(digits);
  if (exponent >= 0) {
    return positive_digit_comp<T>(bigmant, exponent);
  } else {
    return negative_digit_comp<T>(bigmant, am, exponent);
  }
}